

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase170::run(TestCase170 *this)

{
  Disposer *pDVar1;
  long *plVar2;
  PromiseNode *pPVar3;
  char *pcVar4;
  size_t sVar5;
  TransformPromiseNodeBase *pTVar6;
  long lVar7;
  Own<kj::_::ChainPromiseNode> OVar8;
  String result2;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:179:11),_unsigned_long>
  promise;
  String result;
  TwoWayPipe pipe;
  AsyncIoContext ioContext;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  Own<kj::_::PromiseNode> local_f8;
  Own<kj::_::PromiseNode> local_e8;
  String local_d8;
  undefined8 *local_b8;
  TransformPromiseNodeBase *local_b0;
  Own<kj::_::PromiseNode> local_a8;
  Own<kj::_::PromiseNode> local_98;
  String local_88;
  _func_int *local_70;
  long local_68 [3];
  undefined8 *local_50;
  long *local_48;
  undefined8 *local_40;
  long *local_38;
  Disposer local_20;
  
  setupAsyncIo();
  (**(code **)(*local_38 + 8))(&local_70);
  (*(code *)**(undefined8 **)(local_68[0] + 8))(&local_e8,local_68[0] + 8,"foo",3);
  pTVar6 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar6,&local_e8,
             _::
             TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:177:53),_kj::_::PropagateException>
             ::anon_class_16_2_40a49b79_for_func::operator());
  (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00438c68;
  pTVar6[1].super_PromiseNode._vptr_PromiseNode = &local_70;
  pDVar1 = (Disposer *)((long)&local_20._vptr_Disposer + 4);
  pTVar6[1].dependency.disposer = pDVar1;
  local_d8.content.ptr =
       (char *)&_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::TestCase170::run()::$_0,kj::_::PropagateException>>
                ::instance;
  local_d8.content.size_ = (size_t)pTVar6;
  OVar8 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_88,(Own<kj::_::PromiseNode> *)&local_d8);
  sVar5 = local_d8.content.size_;
  local_f8.disposer = (Disposer *)local_88.content.ptr;
  local_f8.ptr = (PromiseNode *)local_88.content.size_;
  if ((TransformPromiseNodeBase *)local_d8.content.size_ != (TransformPromiseNodeBase *)0x0) {
    local_d8.content.size_ = 0;
    (***(_func_int ***)local_d8.content.ptr)
              (local_d8.content.ptr,
               (_func_int *)
               ((long)&((PromiseNode *)sVar5)->_vptr_PromiseNode +
               (long)((PromiseNode *)sVar5)->_vptr_PromiseNode[-2]),OVar8.ptr);
  }
  pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar6,&local_f8,
             _::
             TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:179:11),_kj::_::PropagateException>
             ::anon_class_8_1_8ba005cc_for_func::operator());
  pPVar3 = local_f8.ptr;
  (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00438cf0;
  pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pDVar1;
  local_b8 = &_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::TestCase170::run()::$_1,kj::_::PropagateException>>
              ::instance;
  local_b0 = pTVar6;
  if (local_f8.ptr != (PromiseNode *)0x0) {
    local_f8.ptr = (PromiseNode *)0x0;
    (**(local_f8.disposer)->_vptr_Disposer)
              (local_f8.disposer,
               (_func_int *)((long)&pPVar3->_vptr_PromiseNode + (long)pPVar3->_vptr_PromiseNode[-2])
              );
  }
  pPVar3 = local_e8.ptr;
  if (local_e8.ptr != (PromiseNode *)0x0) {
    local_e8.ptr = (PromiseNode *)0x0;
    (**(local_e8.disposer)->_vptr_Disposer)
              (local_e8.disposer,
               (_func_int *)((long)&pPVar3->_vptr_PromiseNode + (long)pPVar3->_vptr_PromiseNode[-2])
              );
  }
  (*(code *)**(undefined8 **)(local_68[2] + 8))(&local_98,local_68[2] + 8,"bar",3);
  pTVar6 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar6,&local_98,
             _::
             TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:184:58),_kj::_::PropagateException>
             ::anon_class_16_2_40a49b7a_for_func::operator());
  (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00438d78;
  pTVar6[1].super_PromiseNode._vptr_PromiseNode = &local_70;
  pTVar6[1].dependency.disposer = &local_20;
  local_f8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::TestCase170::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_f8.ptr = (PromiseNode *)pTVar6;
  OVar8 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_d8,&local_f8);
  pPVar3 = local_f8.ptr;
  local_a8.disposer._0_4_ = local_d8.content.ptr._0_4_;
  local_a8.disposer._4_4_ = local_d8.content.ptr._4_4_;
  local_a8.ptr = (PromiseNode *)local_d8.content.size_;
  if ((TransformPromiseNodeBase *)local_f8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_f8.ptr = (PromiseNode *)0x0;
    (**(local_f8.disposer)->_vptr_Disposer)
              (local_f8.disposer,
               (_func_int *)
               ((long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode +
               (long)((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2]),OVar8.ptr);
  }
  pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar6,&local_a8,
             _::
             TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:186:11),_kj::_::PropagateException>
             ::anon_class_8_1_8ba005cd_for_func::operator());
  (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00438e00;
  pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_20;
  local_e8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::TestCase170::run()::$_3,kj::_::PropagateException>>
        ::instance;
  local_e8.ptr = (PromiseNode *)pTVar6;
  Promise<kj::String>::wait((Promise<kj::String> *)&local_88,&local_e8);
  pPVar3 = local_e8.ptr;
  if ((TransformPromiseNodeBase *)local_e8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_e8.ptr = (PromiseNode *)0x0;
    (**(local_e8.disposer)->_vptr_Disposer)
              (local_e8.disposer,
               (_func_int *)
               ((long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode +
               (long)((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
  }
  pPVar3 = local_a8.ptr;
  if ((TransformPromiseNodeBase *)local_a8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_a8.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_a8.disposer._4_4_,local_a8.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_a8.disposer._4_4_,local_a8.disposer._0_4_),
               (_func_int *)
               ((long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode +
               (long)((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2]));
  }
  pPVar3 = local_98.ptr;
  if (local_98.ptr != (PromiseNode *)0x0) {
    local_98.ptr = (PromiseNode *)0x0;
    (**(local_98.disposer)->_vptr_Disposer)
              (local_98.disposer,
               (_func_int *)((long)&pPVar3->_vptr_PromiseNode + (long)pPVar3->_vptr_PromiseNode[-2])
              );
  }
  Promise<kj::String>::wait((Promise<kj::String> *)&local_d8,&local_b8);
  if ((((PromiseNode *)local_88.content.size_ != (PromiseNode *)0x4) ||
      (*(char *)((long)(_func_int ***)local_88.content.ptr + 2) != 'o' ||
       *(short *)(_func_int ***)local_88.content.ptr != 0x6f66)) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[37],char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xc1,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (result)\", \"foo\", result",
               (char (*) [37])"failed: expected (\"foo\") == (result)",(char (*) [4])0x38b288,
               &local_88);
  }
  if ((((TransformPromiseNodeBase *)local_d8.content.size_ != (TransformPromiseNodeBase *)0x4) ||
      (*(char *)((long)(_func_int ***)local_d8.content.ptr + 2) != 'r' ||
       *(short *)(_func_int ***)local_d8.content.ptr != 0x6162)) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[38],char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xc2,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (result2)\", \"bar\", result2",
               (char (*) [38])"failed: expected (\"bar\") == (result2)",(char (*) [4])0x370438,
               &local_d8);
  }
  sVar5 = local_d8.content.size_;
  pcVar4 = local_d8.content.ptr;
  if ((Disposer *)local_d8.content.ptr != (Disposer *)0x0) {
    local_d8.content.ptr = (char *)0x0;
    local_d8.content.size_ = 0;
    (**(local_d8.content.disposer)->_vptr_ArrayDisposer)
              (local_d8.content.disposer,pcVar4,1,sVar5,sVar5,0);
  }
  sVar5 = local_88.content.size_;
  pcVar4 = local_88.content.ptr;
  if ((Disposer *)local_88.content.ptr != (Disposer *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar4,1,sVar5,sVar5,0);
  }
  pTVar6 = local_b0;
  if (local_b0 != (TransformPromiseNodeBase *)0x0) {
    local_b0 = (TransformPromiseNodeBase *)0x0;
    (**(code **)*local_b8)
              (local_b8,(_func_int *)
                        ((long)&(pTVar6->super_PromiseNode)._vptr_PromiseNode +
                        (long)(pTVar6->super_PromiseNode)._vptr_PromiseNode[-2]));
  }
  lVar7 = 0x10;
  do {
    plVar2 = *(long **)((long)local_68 + lVar7);
    if (plVar2 != (long *)0x0) {
      *(undefined8 *)((long)local_68 + lVar7) = 0;
      (**(code **)**(undefined8 **)((long)&local_70 + lVar7))
                (*(undefined8 **)((long)&local_70 + lVar7),(long)plVar2 + *(long *)(*plVar2 + -0x10)
                );
    }
    plVar2 = local_38;
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -0x10);
  if (local_38 != (long *)0x0) {
    local_38 = (long *)0x0;
    (**(code **)*local_40)(local_40,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  plVar2 = local_48;
  if (local_48 != (long *)0x0) {
    local_48 = (long *)0x0;
    (**(code **)*local_50)(local_50,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return;
}

Assistant:

TEST(AsyncIo, TwoWayPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newTwoWayPipe();
  char receiveBuffer1[4];
  char receiveBuffer2[4];

  auto promise = pipe.ends[0]->write("foo", 3).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  kj::String result = pipe.ends[1]->write("bar", 3).then([&]() {
    return pipe.ends[1]->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
  EXPECT_EQ("bar", result2);
}